

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  int iVar1;
  int iVar2;
  int32 i;
  Message *pMVar3;
  Rep *pRVar4;
  void *pvVar5;
  key_type *__k;
  Symbol symbol;
  int iVar6;
  Descriptor *pDVar7;
  string *psVar8;
  string *psVar9;
  void *pvVar10;
  size_t sVar11;
  iterator iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined8 *puVar16;
  undefined1 *orig_options;
  long lVar17;
  SubstituteArg *in_stack_fffffffffffffd58;
  string local_280;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  long local_1a0;
  SubstituteArg local_198;
  SubstituteArg local_168;
  SubstituteArg local_138;
  SubstituteArg local_108;
  SubstituteArg local_d8;
  SubstituteArg local_a8;
  undefined4 local_78;
  undefined4 uStack_74;
  EnumDescriptor *pEStack_70;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_name_set;
  
  pDVar7 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar7 = (Descriptor *)this->file_;
  }
  psVar8 = AllocateNameString(this,*(string **)(pDVar7 + 8),(proto->name_).ptr_);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar8,&proto->super_Message);
  psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar9;
  *(string **)(result + 8) = psVar8;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  iVar6 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 == 0) {
    AddError(this,psVar8,&proto->super_Message,NAME,"Enums must contain at least one value.");
    iVar6 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  }
  *(int *)(result + 0x2c) = iVar6;
  pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0x28);
  *(void **)(result + 0x30) = pvVar10;
  if (0 < (proto->value_).super_RepeatedPtrFieldBase.current_size_) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      BuildEnumValue(this,(EnumValueDescriptorProto *)
                          ((proto->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar17],result
                     ,(EnumValueDescriptor *)(*(long *)(result + 0x30) + lVar15));
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x28;
    } while (lVar17 < (proto->value_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x38) = iVar6;
  pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 << 3);
  *(void **)(result + 0x40) = pvVar10;
  iVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar6) {
    lVar15 = 0;
    do {
      pMVar3 = (Message *)
               ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar15];
      lVar17 = *(long *)(result + 0x40);
      iVar1 = *(int *)&pMVar3[3].super_MessageLite._vptr_MessageLite;
      *(int *)(lVar17 + lVar15 * 8) = iVar1;
      iVar2 = *(int *)((long)&pMVar3[3].super_MessageLite._vptr_MessageLite + 4);
      *(int *)(lVar17 + 4 + lVar15 * 8) = iVar2;
      if (iVar2 < iVar1) {
        AddError(this,*(string **)(result + 8),pMVar3,NUMBER,
                 "Reserved range end number must be greater than start number.");
        iVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar6);
  }
  iVar6 = (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x3c) = iVar6;
  pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 8);
  *(void **)(result + 0x48) = pvVar10;
  if (0 < (long)iVar6) {
    lVar15 = 0;
    do {
      psVar8 = DescriptorPool::Tables::AllocateString
                         (this->tables_,
                          (string *)
                          ((proto->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements
                          [lVar15]);
      *(string **)(*(long *)(result + 0x48) + lVar15 * 8) = psVar8;
      lVar15 = lVar15 + 1;
    } while (iVar6 != lVar15);
  }
  CheckEnumValueUniqueness(this,proto,result);
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = (undefined1 *)proto->options_;
    if ((EnumOptions *)orig_options == (EnumOptions *)0x0) {
      orig_options = _EnumOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::EnumDescriptor>(this,(OptionsType *)orig_options,result,3);
  }
  local_78 = 4;
  symbol._4_4_ = uStack_74;
  symbol.type = 4;
  symbol.field_1.enum_descriptor = result;
  pEStack_70 = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  iVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar6) {
    lVar17 = 2;
    lVar15 = 0;
    do {
      lVar14 = lVar15 + 1;
      lVar13 = (long)iVar6;
      if (lVar14 < lVar13) {
        pvVar10 = ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar15];
        lVar13 = lVar17;
        local_1a0 = lVar14;
        do {
          pRVar4 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
          pvVar5 = pRVar4->elements[lVar13 + -1];
          if ((*(int32 *)((long)pvVar5 + 0x18) <= *(int *)((long)pvVar10 + 0x1c)) &&
             (*(int *)((long)pvVar10 + 0x18) <= *(int *)((long)pvVar5 + 0x1c))) {
            psVar8 = *(string **)(result + 8);
            pMVar3 = (Message *)pRVar4->elements[lVar15];
            reserved_name_set._M_h._M_buckets =
                 (__buckets_ptr)
                 FastInt32ToBuffer(*(int32 *)((long)pvVar5 + 0x18),
                                   (char *)((long)&reserved_name_set._M_h._M_bucket_count + 4));
            sVar11 = strlen((char *)reserved_name_set._M_h._M_buckets);
            reserved_name_set._M_h._M_bucket_count =
                 CONCAT44(reserved_name_set._M_h._M_bucket_count._4_4_,(int)sVar11);
            local_260.text_ = FastInt32ToBuffer(*(int32 *)((long)pvVar5 + 0x1c),local_260.scratch_);
            sVar11 = strlen(local_260.text_);
            local_260.size_ = (int)sVar11;
            local_200.text_ = FastInt32ToBuffer(*(int32 *)((long)pvVar10 + 0x18),local_200.scratch_)
            ;
            sVar11 = strlen(local_200.text_);
            local_200.size_ = (int)sVar11;
            local_1d0.text_ = FastInt32ToBuffer(*(int32 *)((long)pvVar10 + 0x1c),local_1d0.scratch_)
            ;
            sVar11 = strlen(local_1d0.text_);
            local_1d0.size_ = (int)sVar11;
            local_a8.text_ = (char *)0x0;
            local_a8.size_ = -1;
            local_d8.text_ = (char *)0x0;
            local_d8.size_ = -1;
            local_108.text_ = (char *)0x0;
            local_108.size_ = -1;
            local_138.text_ = (char *)0x0;
            local_138.size_ = -1;
            local_168.text_ = (char *)0x0;
            local_168.size_ = -1;
            local_198.text_ = (char *)0x0;
            local_198.size_ = -1;
            strings::Substitute_abi_cxx11_
                      ((string *)&local_230,
                       (strings *)
                       "Reserved range $0 to $1 overlaps with already-defined range $2 to $3.",
                       (char *)&reserved_name_set,&local_260,&local_200,&local_1d0,&local_a8,
                       &local_d8,&local_108,&local_138,&local_168,&local_198,
                       in_stack_fffffffffffffd58);
            AddError(this,psVar8,pMVar3,NUMBER,(string *)&local_230);
            if (local_230.text_ != local_230.scratch_ + 4) {
              operator_delete(local_230.text_);
            }
            iVar6 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
          }
          iVar1 = (int)lVar13;
          lVar13 = lVar13 + 1;
        } while (iVar1 < iVar6);
        lVar13 = (long)iVar6;
        lVar14 = local_1a0;
      }
      lVar17 = lVar17 + 1;
      lVar15 = lVar14;
    } while (lVar14 < lVar13);
  }
  reserved_name_set._M_h._M_buckets = &reserved_name_set._M_h._M_single_bucket;
  reserved_name_set._M_h._M_bucket_count = 1;
  reserved_name_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reserved_name_set._M_h._M_element_count = 0;
  reserved_name_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reserved_name_set._M_h._M_rehash_policy._M_next_resize = 0;
  reserved_name_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_) {
    lVar15 = 0;
    do {
      __k = (key_type *)((proto->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[lVar15];
      iVar12 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&reserved_name_set._M_h,__k);
      if (iVar12.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_260.text_ = (char *)&reserved_name_set._M_h;
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&reserved_name_set._M_h,__k,&local_260);
      }
      else {
        local_260.text_ = (__k->_M_dataplus)._M_p;
        local_260.size_ = (int)__k->_M_string_length;
        local_200.text_ = (char *)0x0;
        local_200.size_ = -1;
        local_1d0.text_ = (char *)0x0;
        local_1d0.size_ = -1;
        local_a8.text_ = (char *)0x0;
        local_a8.size_ = -1;
        local_d8.text_ = (char *)0x0;
        local_d8.size_ = -1;
        local_108.text_ = (char *)0x0;
        local_108.size_ = -1;
        local_138.text_ = (char *)0x0;
        local_138.size_ = -1;
        local_168.text_ = (char *)0x0;
        local_168.size_ = -1;
        local_198.text_ = (char *)0x0;
        local_198.size_ = -1;
        local_230.text_ = (char *)0x0;
        local_230.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_280,(strings *)"Enum value \"$0\" is reserved multiple times.",
                   (char *)&local_260,&local_200,&local_1d0,&local_a8,&local_d8,&local_108,
                   &local_138,&local_168,&local_198,&local_230,in_stack_fffffffffffffd58);
        AddError(this,__k,&proto->super_Message,NAME,&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < *(int *)(result + 0x2c)) {
    lVar15 = 0;
    do {
      puVar16 = (undefined8 *)(lVar15 * 0x28 + *(long *)(result + 0x30));
      iVar6 = *(int *)(result + 0x38);
      if (0 < iVar6) {
        lVar17 = 0;
        do {
          i = *(int32 *)(puVar16 + 2);
          if ((*(int *)(*(long *)(result + 0x40) + lVar17 * 8) <= i) &&
             (i <= *(int *)(*(long *)(result + 0x40) + 4 + lVar17 * 8))) {
            psVar8 = (string *)puVar16[1];
            pMVar3 = (Message *)
                     ((proto->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar17];
            local_260.text_ = *(char **)*puVar16;
            local_260.size_ = *(int *)((undefined8 *)*puVar16 + 1);
            local_200.text_ = FastInt32ToBuffer(i,local_200.scratch_);
            sVar11 = strlen(local_200.text_);
            local_200.size_ = (int)sVar11;
            local_1d0.text_ = (char *)0x0;
            local_1d0.size_ = -1;
            local_a8.text_ = (char *)0x0;
            local_a8.size_ = -1;
            local_d8.text_ = (char *)0x0;
            local_d8.size_ = -1;
            local_108.text_ = (char *)0x0;
            local_108.size_ = -1;
            local_138.text_ = (char *)0x0;
            local_138.size_ = -1;
            local_168.text_ = (char *)0x0;
            local_168.size_ = -1;
            local_198.text_ = (char *)0x0;
            local_198.size_ = -1;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_280,(strings *)"Enum value \"$0\" uses reserved number $1.",
                       (char *)&local_260,&local_200,&local_1d0,&local_a8,&local_d8,&local_108,
                       &local_138,&local_168,&local_198,&local_230,in_stack_fffffffffffffd58);
            AddError(this,psVar8,pMVar3,NUMBER,&local_280);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p);
            }
            iVar6 = *(int *)(result + 0x38);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar6);
      }
      iVar12 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&reserved_name_set._M_h,(key_type *)*puVar16);
      if (iVar12.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        psVar8 = (string *)puVar16[1];
        pMVar3 = (Message *)((proto->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar15];
        local_260.text_ = *(char **)*puVar16;
        local_260.size_ = *(int *)((undefined8 *)*puVar16 + 1);
        local_200.text_ = (char *)0x0;
        local_200.size_ = -1;
        local_1d0.text_ = (char *)0x0;
        local_1d0.size_ = -1;
        local_a8.text_ = (char *)0x0;
        local_a8.size_ = -1;
        local_d8.text_ = (char *)0x0;
        local_d8.size_ = -1;
        local_108.text_ = (char *)0x0;
        local_108.size_ = -1;
        local_138.text_ = (char *)0x0;
        local_138.size_ = -1;
        local_168.text_ = (char *)0x0;
        local_168.size_ = -1;
        local_198.text_ = (char *)0x0;
        local_198.size_ = -1;
        local_230.text_ = (char *)0x0;
        local_230.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_280,(strings *)"Enum value \"$0\" is reserved.",(char *)&local_260,
                   &local_200,&local_1d0,&local_a8,&local_d8,&local_108,&local_138,&local_168,
                   &local_198,&local_230,in_stack_fffffffffffffd58);
        AddError(this,psVar8,pMVar3,NAME,&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)(result + 0x2c));
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&reserved_name_set._M_h);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const std::string& scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  std::string* full_name = AllocateNameString(scope, proto.name());
  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      tables_->AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] =
        tables_->AllocateString(proto.reserved_name(i));
  }

  CheckEnumValueUniqueness(proto, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    EnumDescriptorProto::kOptionsFieldNumber);
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Reserved range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2.start(), range2.end(),
                                     range1.start(), range1.end()));
      }
    }
  }

  HASH_SET<std::string> reserved_name_set;
  for (int i = 0; i < proto.reserved_name_size(); i++) {
    const std::string& name = proto.reserved_name(i);
    if (reserved_name_set.find(name) == reserved_name_set.end()) {
      reserved_name_set.insert(name);
    } else {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                   "Enum value \"$0\" is reserved multiple times.", name));
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(
            value->full_name(), proto.reserved_range(j),
            DescriptorPool::ErrorCollector::NUMBER,
            strings::Substitute("Enum value \"$0\" uses reserved number $1.",
                                value->name(), value->number()));
      }
    }
    if (reserved_name_set.find(value->name()) != reserved_name_set.end()) {
      AddError(
          value->full_name(), proto.value(i),
          DescriptorPool::ErrorCollector::NAME,
          strings::Substitute("Enum value \"$0\" is reserved.", value->name()));
    }
  }
}